

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O2

void __thiscall
amrex::DeriveRec::getRange(DeriveRec *this,int k,int *state_indx,int *src_comp,int *num_comp)

{
  StateRange *pSVar1;
  StateRange **ppSVar2;
  
  ppSVar2 = &this->rng;
  for (; (pSVar1 = *ppSVar2, pSVar1 != (StateRange *)0x0 && (0 < k)); k = k + -1) {
    ppSVar2 = &pSVar1->next;
  }
  if (pSVar1 != (StateRange *)0x0) {
    *state_indx = pSVar1->typ;
    *src_comp = pSVar1->sc;
    *num_comp = pSVar1->nc;
  }
  return;
}

Assistant:

void
DeriveRec::getRange (int  k,
                     int& state_indx,
                     int& src_comp,
                     int& num_comp) const
{
    StateRange* r;

    for (r = rng; r != 0 && k > 0; k--, r = r->next)
        ;
    BL_ASSERT(r != 0);
    if (r != 0) {
        state_indx = r->typ;
        src_comp   = r->sc;
        num_comp   = r->nc;
    }
}